

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

ColumnList *
duckdb::Parser::ParseColumnList
          (ColumnList *__return_storage_ptr__,string *column_list,ParserOptions options)

{
  pointer pCVar1;
  __buckets_ptr pp_Var2;
  long *plVar3;
  reference pvVar4;
  pointer pSVar5;
  CreateStatement *pCVar6;
  pointer pCVar7;
  ParserException *this;
  InternalException *this_00;
  size_type *psVar8;
  Parser parser;
  string mock_query;
  string local_98;
  Parser local_78;
  string local_48;
  
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   "CREATE TABLE tbl (",column_list);
  plVar3 = (long *)::std::__cxx11::string::append((char *)&local_78);
  psVar8 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_48.field_2._M_allocated_capacity = *psVar8;
    local_48.field_2._8_8_ = plVar3[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar8;
    local_48._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_48._M_string_length = plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_78.statements.
      super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_78.statements.
                       super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                       ._M_impl.super__Vector_impl_data + 0x10U)) {
    operator_delete(local_78.statements.
                    super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Parser(&local_78,options);
  ParseQuery(&local_78,&local_48);
  if ((long)local_78.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_78.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::operator[](&local_78.statements,0);
    pSVar5 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar4);
    if (pSVar5->type == CREATE_STATEMENT) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::operator[](&local_78.statements,0);
      pSVar5 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(pvVar4);
      pCVar6 = SQLStatement::Cast<duckdb::CreateStatement>(pSVar5);
      pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->(&pCVar6->info);
      if ((pCVar7->super_ParseInfo).field_0x9 == '\x01') {
        pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                 operator->(&pCVar6->info);
        pCVar1 = *(pointer *)((long)&pCVar7[1].catalog.field_2 + 8);
        (__return_storage_ptr__->columns).
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)pCVar7[1].catalog.field_2._M_allocated_capacity;
        (__return_storage_ptr__->columns).
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_finish = pCVar1;
        (__return_storage_ptr__->columns).
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)pCVar7[1].schema._M_dataplus._M_p;
        pCVar7[1].schema._M_dataplus._M_p = (pointer)0x0;
        pCVar7[1].catalog.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&pCVar7[1].catalog.field_2 + 8) = 0;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&__return_storage_ptr__->name_map,&pCVar7[1].schema._M_string_length);
        pp_Var2 = pCVar7[1].dependencies.set._M_h._M_buckets;
        (__return_storage_ptr__->physical_columns).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)((long)&pCVar7[1].sql.field_2 + 8);
        (__return_storage_ptr__->physical_columns).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pp_Var2;
        (__return_storage_ptr__->physical_columns).
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)pCVar7[1].dependencies.set._M_h._M_bucket_count;
        pCVar7[1].dependencies.set._M_h._M_bucket_count = 0;
        *(undefined8 *)((long)&pCVar7[1].sql.field_2 + 8) = 0;
        pCVar7[1].dependencies.set._M_h._M_buckets = (__buckets_ptr)0x0;
        __return_storage_ptr__->allow_duplicate_names =
             *(bool *)&pCVar7[1].dependencies.set._M_h._M_before_begin._M_nxt;
        ::std::
        vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                   *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        return __return_storage_ptr__;
      }
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Expected a single CREATE TABLE statement","");
      InternalException::InternalException(this_00,&local_98);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this = (ParserException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Expected a single CREATE statement","");
  ParserException::ParserException(this,&local_98);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ColumnList Parser::ParseColumnList(const string &column_list, ParserOptions options) {
	string mock_query = "CREATE TABLE tbl (" + column_list + ")";
	Parser parser(options);
	parser.ParseQuery(mock_query);
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::CREATE_STATEMENT) {
		throw ParserException("Expected a single CREATE statement");
	}
	auto &create = parser.statements[0]->Cast<CreateStatement>();
	if (create.info->type != CatalogType::TABLE_ENTRY) {
		throw InternalException("Expected a single CREATE TABLE statement");
	}
	auto &info = create.info->Cast<CreateTableInfo>();
	return std::move(info.columns);
}